

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterATT.c
# Opt level: O0

ZyanStatus
ZydisFormatterATTPrintMnemonic
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  ZydisBranchType ZVar1;
  ZydisShortString *source;
  ZydisDecodedOperand *operand_00;
  ZydisDecodedOperand *operand;
  ZyanU32 local_48;
  ZyanU8 i;
  ZyanU32 size;
  ZyanStatus status_047620348_4;
  ZyanStatus status_047620348_3;
  ZyanStatus status_047620348_2;
  ZyanStatus status_047620348_1;
  ZyanStatus status_047620348;
  ZydisShortString *mnemonic;
  ZydisFormatterContext *context_local;
  ZydisFormatterBuffer *buffer_local;
  ZydisFormatter *formatter_local;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x115,
                  "ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x116,
                  "ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x117,
                  "ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context->instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("context->instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x118,
                  "ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context->operands == (ZydisDecodedOperand *)0x0) {
    __assert_fail("context->operands",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x119,
                  "ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  source = ZydisMnemonicGetStringWrapped(context->instruction->mnemonic);
  if (source == (ZydisShortString *)0x0) {
    if (buffer->is_token_list == '\0') {
      formatter_local._4_4_ =
           ZydisStringAppendShortCase
                     (&buffer->string,&STR_INVALID_MNEMONIC,formatter->case_mnemonic);
    }
    else {
      formatter_local._4_4_ =
           ZydisFormatterBufferAppendPredefined
                     (buffer,(ZydisPredefinedToken *)&TOK_DATA_INVALID_MNEMONIC);
    }
    if ((formatter_local._4_4_ & 0x80000000) == 0) {
      formatter_local._4_4_ = 0x100000;
    }
  }
  else if ((((buffer->is_token_list == '\0') ||
            (formatter_local._4_4_ = ZydisFormatterBufferAppend(buffer,'\x06'),
            (formatter_local._4_4_ & 0x80000000) == 0)) &&
           (((context->instruction->meta).branch_type != ZYDIS_BRANCH_TYPE_FAR ||
            (formatter_local._4_4_ =
                  ZydisStringAppendShortCase(&buffer->string,&STR_FAR_ATT,formatter->case_mnemonic),
            (formatter_local._4_4_ & 0x80000000) == 0)))) &&
          (formatter_local._4_4_ =
                ZydisStringAppendShortCase(&buffer->string,source,formatter->case_mnemonic),
          (formatter_local._4_4_ & 0x80000000) == 0)) {
    local_48 = 0;
    for (operand._7_1_ = 0; operand._7_1_ < context->instruction->operand_count_visible;
        operand._7_1_ = operand._7_1_ + 1) {
      operand_00 = context->operands + operand._7_1_;
      if ((operand_00->type == ZYDIS_OPERAND_TYPE_MEMORY) &&
         (((operand_00->field_10).mem.type == ZYDIS_MEMOP_TYPE_MEM ||
          ((operand_00->field_10).mem.type == ZYDIS_MEMOP_TYPE_MAX_VALUE)))) {
        local_48 = ZydisFormatterHelperGetExplicitSize(formatter,context,operand_00);
        break;
      }
    }
    if (local_48 == 8) {
      ZydisStringAppendShort(&buffer->string,&STR_SIZE_8_ATT);
    }
    else if (local_48 == 0x10) {
      ZydisStringAppendShort(&buffer->string,&STR_SIZE_16_ATT);
    }
    else if (local_48 == 0x20) {
      ZydisStringAppendShort(&buffer->string,&STR_SIZE_32_ATT);
    }
    else if (local_48 == 0x40) {
      ZydisStringAppendShort(&buffer->string,&STR_SIZE_64_ATT);
    }
    else if (local_48 == 0x80) {
      ZydisStringAppendShort(&buffer->string,&STR_SIZE_128_ATT);
    }
    else if (local_48 == 0x100) {
      ZydisStringAppendShort(&buffer->string,&STR_SIZE_256_ATT);
    }
    else if (local_48 == 0x200) {
      ZydisStringAppendShort(&buffer->string,&STR_SIZE_512_ATT);
    }
    if ((formatter->print_branch_size == '\0') ||
       (ZVar1 = (context->instruction->meta).branch_type, ZVar1 == ZYDIS_BRANCH_TYPE_NONE)) {
      formatter_local._4_4_ = 0x100000;
    }
    else if (ZVar1 == ZYDIS_BRANCH_TYPE_SHORT) {
      formatter_local._4_4_ =
           ZydisStringAppendShortCase(&buffer->string,&STR_SHORT,formatter->case_mnemonic);
    }
    else if (ZVar1 == ZYDIS_BRANCH_TYPE_NEAR) {
      formatter_local._4_4_ =
           ZydisStringAppendShortCase(&buffer->string,&STR_NEAR,formatter->case_mnemonic);
    }
    else {
      formatter_local._4_4_ = 0x80100004;
    }
  }
  return formatter_local._4_4_;
}

Assistant:

ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);
    ZYAN_ASSERT(context->instruction);
    ZYAN_ASSERT(context->operands);

    const ZydisShortString* mnemonic = ZydisMnemonicGetStringWrapped(
        context->instruction->mnemonic);
    if (!mnemonic)
    {
        ZYDIS_BUFFER_APPEND_CASE(buffer, INVALID_MNEMONIC, formatter->case_mnemonic);
        return ZYAN_STATUS_SUCCESS;
    }

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_MNEMONIC);
    if (context->instruction->meta.branch_type == ZYDIS_BRANCH_TYPE_FAR)
    {
        ZYAN_CHECK(ZydisStringAppendShortCase(&buffer->string, &STR_FAR_ATT,
            formatter->case_mnemonic));
    }
    ZYAN_CHECK(ZydisStringAppendShortCase(&buffer->string, mnemonic, formatter->case_mnemonic));

    // Append operand-size suffix
    ZyanU32 size = 0;
    for (ZyanU8 i = 0; i < context->instruction->operand_count_visible; ++i)
    {
        const ZydisDecodedOperand* const operand = &context->operands[i];
        if ((operand->type == ZYDIS_OPERAND_TYPE_MEMORY) &&
            ((operand->mem.type == ZYDIS_MEMOP_TYPE_MEM) ||
             (operand->mem.type == ZYDIS_MEMOP_TYPE_VSIB)))
        {
            size = ZydisFormatterHelperGetExplicitSize(formatter, context, operand);
            break;
        }
    }

    switch (size)
    {
    case   8: ZydisStringAppendShort(&buffer->string, &STR_SIZE_8_ATT  ); break;
    case  16: ZydisStringAppendShort(&buffer->string, &STR_SIZE_16_ATT ); break;
    case  32: ZydisStringAppendShort(&buffer->string, &STR_SIZE_32_ATT ); break;
    case  64: ZydisStringAppendShort(&buffer->string, &STR_SIZE_64_ATT ); break;
    case 128: ZydisStringAppendShort(&buffer->string, &STR_SIZE_128_ATT); break;
    case 256: ZydisStringAppendShort(&buffer->string, &STR_SIZE_256_ATT); break;
    case 512: ZydisStringAppendShort(&buffer->string, &STR_SIZE_512_ATT); break;
    default:
        break;
    }

    if (formatter->print_branch_size)
    {
        switch (context->instruction->meta.branch_type)
        {
        case ZYDIS_BRANCH_TYPE_NONE:
            break;
        case ZYDIS_BRANCH_TYPE_SHORT:
            return ZydisStringAppendShortCase(&buffer->string, &STR_SHORT,
                formatter->case_mnemonic);
        case ZYDIS_BRANCH_TYPE_NEAR:
            return ZydisStringAppendShortCase(&buffer->string, &STR_NEAR,
                formatter->case_mnemonic);
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
    }

    return ZYAN_STATUS_SUCCESS;
}